

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_GetPolySpots(MapData *map,TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *spots,
                   TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *anchors)

{
  double *pdVar1;
  long *plVar2;
  short sVar3;
  TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *this;
  long lVar4;
  uint i;
  ulong uVar5;
  FPolyStart local_34;
  
  lVar4 = 0x28;
  for (uVar5 = 0; uVar5 < MapThingsConverted.Count; uVar5 = uVar5 + 1) {
    plVar2 = *(long **)((long)(MapThingsConverted.Array)->args + lVar4 + -0x38);
    if (((plVar2 != (long *)0x0) && (*plVar2 == 0)) &&
       (sVar3 = (short)(int)plVar2[1], (ushort)(sVar3 - 0xbU) < 4)) {
      pdVar1 = (double *)((long)(MapThingsConverted.Array)->args + lVar4 + -0x58);
      local_34.x = SUB84(*pdVar1 + 103079215104.0,0);
      local_34.y = SUB84(pdVar1[1] + 103079215104.0,0);
      local_34.polynum = (int)*(short *)((long)(MapThingsConverted.Array)->args + lVar4 + -0x40);
      this = anchors;
      if (sVar3 != 0xb) {
        this = spots;
      }
      TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::Push(this,&local_34);
    }
    lVar4 = lVar4 + 0x90;
  }
  return;
}

Assistant:

void P_GetPolySpots (MapData * map, TArray<FNodeBuilder::FPolyStart> &spots, TArray<FNodeBuilder::FPolyStart> &anchors)
{
	//if (map->HasBehavior)
	{
		for (unsigned int i = 0; i < MapThingsConverted.Size(); ++i)
		{
			FDoomEdEntry *mentry = MapThingsConverted[i].info;
			if (mentry != NULL && mentry->Type == NULL && mentry->Special >= SMT_PolyAnchor && mentry->Special <= SMT_PolySpawnHurt)
			{
				FNodeBuilder::FPolyStart newvert;
				newvert.x = FLOAT2FIXED(MapThingsConverted[i].pos.X);
				newvert.y = FLOAT2FIXED(MapThingsConverted[i].pos.Y);
				newvert.polynum = MapThingsConverted[i].angle;
				if (mentry->Special == SMT_PolyAnchor)
				{
					anchors.Push (newvert);
				}
				else
				{
					spots.Push (newvert);
				}
			}
		}
	}
}